

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GroupTableFree(TA_StringTable *table)

{
  void *in_RDI;
  TA_StringTablePriv *stringTablePriv;
  
  if (in_RDI != (void *)0x0) {
    if (*(int **)((long)in_RDI + 0x10) == (int *)0x0) {
      return TA_INTERNAL_ERROR|TA_LIB_NOT_INITIALIZE;
    }
    if (**(int **)((long)in_RDI + 0x10) != -0x5df44df5) {
      return TA_BAD_OBJECT;
    }
    free(in_RDI);
  }
  return TA_SUCCESS;
}

Assistant:

TA_RetCode TA_GroupTableFree( TA_StringTable *table )
{
   TA_StringTablePriv *stringTablePriv;

   if( table )
   {
      stringTablePriv = (TA_StringTablePriv *)table->hiddenData;
      if( !stringTablePriv )
      {
         return TA_INTERNAL_ERROR(1);
      }

      if( stringTablePriv->magicNumber != TA_STRING_TABLE_GROUP_MAGIC_NB )
      {
         return TA_BAD_OBJECT;
      }

      TA_Free( table );
   }

   return TA_SUCCESS;
}